

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::BeginTryTableExpr
          (ExprVisitorDelegate *this,TryTableExpr *expr)

{
  WatWriter *pWVar1;
  pointer pTVar2;
  pointer pTVar3;
  Var *pVVar4;
  ulong uVar5;
  WatWriter *this_00;
  Var *var;
  Info local_78;
  
  pWVar1 = this->writer_;
  Opcode::GetInfo(&local_78,(Opcode *)&Opcode::TryTable_Opcode);
  WritePuts(pWVar1,local_78.name,Space);
  if ((expr->block).label._M_string_length == 0) {
    WriteTypes(this->writer_,&(expr->block).decl.sig.param_types,"param");
    WriteTypes(this->writer_,&(expr->block).decl.sig.result_types,"result");
    pWVar1 = this->writer_;
    Writef(pWVar1," ;; label = @%u",
           (ulong)(uint)((int)((ulong)((long)(pWVar1->super_ModuleContext).label_stack_.
                                             super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pWVar1->super_ModuleContext).label_stack_.
                                            super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d));
  }
  else {
    WritePuts(this->writer_,(expr->block).label._M_dataplus._M_p,Space);
    WriteTypes(this->writer_,&(expr->block).decl.sig.param_types,"param");
    WriteTypes(this->writer_,&(expr->block).decl.sig.result_types,"result");
  }
  pWVar1 = this->writer_;
  this_00 = pWVar1;
  if (pWVar1->next_char_ == ForceNewline) {
    WriteNextChar(pWVar1);
    this_00 = this->writer_;
  }
  pWVar1->next_char_ = ForceNewline;
  this_00->indent_ = this_00->indent_ + 2;
  pTVar2 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar3) {
    var = &pTVar2->target;
    do {
      WritePuts(this->writer_,"(",None);
      uVar5 = (ulong)(uint)var[1].loc.filename._M_len;
      if (uVar5 < 4) {
        WritePuts(this->writer_,*(char **)(&DAT_0017b5e8 + uVar5 * 8),Space);
        if ((uint)var[1].loc.filename._M_len < 2) {
          WriteVar(this->writer_,var + -1,Space);
        }
      }
      WriteBrVar(this->writer_,var,None);
      WritePuts(this->writer_,")",Newline);
      pVVar4 = var + 1;
      var = (Var *)&var[2].field_2;
    } while ((pointer)&(pVVar4->loc).filename._M_str != pTVar3);
    this_00 = this->writer_;
  }
  ModuleContext::BeginBlock(&this_00->super_ModuleContext,TryTable,&expr->block);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::BeginTryTableExpr(TryTableExpr* expr) {
  // copied from WriteBeginBlock, try_table needs to push label *after*
  // writing catches
  writer_->WritePutsSpace(Opcode::TryTable_Opcode.GetName());
  bool has_label = !expr->block.label.empty();
  if (has_label) {
    writer_->WriteString(expr->block.label, NextChar::Space);
  }
  writer_->WriteTypes(expr->block.decl.sig.param_types, "param");
  writer_->WriteTypes(expr->block.decl.sig.result_types, "result");
  if (!has_label) {
    writer_->Writef(" ;; label = @%" PRIindex, writer_->GetLabelStackSize());
  }
  writer_->WriteNewline(FORCE_NEWLINE);
  writer_->Indent();
  for (const auto& catch_ : expr->catches) {
    writer_->WritePuts("(", NextChar::None);
    switch (catch_.kind) {
      case CatchKind::Catch:
        writer_->WritePutsSpace("catch");
        break;
      case CatchKind::CatchRef:
        writer_->WritePutsSpace("catch_ref");
        break;
      case CatchKind::CatchAll:
        writer_->WritePutsSpace("catch_all");
        break;
      case CatchKind::CatchAllRef:
        writer_->WritePutsSpace("catch_all_ref");
        break;
    }
    if (catch_.kind == CatchKind::Catch || catch_.kind == CatchKind::CatchRef) {
      writer_->WriteVar(catch_.tag, NextChar::Space);
    }
    writer_->WriteBrVar(catch_.target, NextChar::None);
    writer_->WritePuts(")", NextChar::Newline);
  }
  writer_->BeginBlock(LabelType::TryTable, expr->block);
  return Result::Ok;
}